

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_sample.c
# Opt level: O1

_Bool al_set_default_mixer(ALLEGRO_MIXER *mixer)

{
  bool bVar1;
  _Bool _Var2;
  char cVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  ALLEGRO_SAMPLE_INSTANCE *spl;
  char *pcVar7;
  undefined8 in_R9;
  int iVar8;
  
  uVar5 = 1;
  _Var2 = true;
  if ((default_mixer != mixer) && (default_mixer = mixer, 0 < (int)auto_samples._size)) {
    iVar8 = 0;
    do {
      puVar6 = (undefined8 *)_al_vector_ref(&auto_samples,iVar8);
      *(undefined4 *)(puVar6 + 1) = 0;
      al_destroy_sample_instance((ALLEGRO_SAMPLE_INSTANCE *)*puVar6);
      *(undefined1 *)((long)puVar6 + 0xc) = 0;
      spl = al_create_sample_instance((ALLEGRO_SAMPLE *)0x0);
      *puVar6 = spl;
      if (spl == (ALLEGRO_SAMPLE_INSTANCE *)0x0) {
        cVar3 = _al_trace_prefix("audio",3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/kcm_sample.c"
                                 ,0x120,"al_set_default_mixer",in_R9,uVar5);
        pcVar7 = "al_create_sample failed\n";
LAB_0010bd6c:
        if (cVar3 == '\0') {
          iVar4 = 5;
          bVar1 = false;
        }
        else {
          bVar1 = false;
          _al_trace_suffix(pcVar7);
          iVar4 = 5;
        }
      }
      else {
        _Var2 = al_attach_sample_instance_to_mixer(spl,default_mixer);
        if (!_Var2) {
          cVar3 = _al_trace_prefix("audio",3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/kcm_sample.c"
                                   ,0x124,"al_set_default_mixer");
          pcVar7 = "al_attach_mixer_to_sample failed\n";
          goto LAB_0010bd6c;
        }
        iVar4 = 0;
        bVar1 = true;
      }
      if (!bVar1) goto LAB_0010bd9d;
      iVar8 = iVar8 + 1;
    } while (iVar8 < (int)auto_samples._size);
    iVar4 = 0;
LAB_0010bd9d:
    _Var2 = iVar4 == 0;
    if (!_Var2) {
      free_sample_vector();
      default_mixer = (ALLEGRO_MIXER *)0x0;
    }
  }
  return _Var2;
}

Assistant:

bool al_set_default_mixer(ALLEGRO_MIXER *mixer)
{
   ASSERT(mixer != NULL);

   if (mixer != default_mixer) {
      int i;

      default_mixer = mixer;

      /* Destroy all current sample instances, recreate them, and
       * attach them to the new mixer */
      for (i = 0; i < (int) _al_vector_size(&auto_samples); i++) {
         AUTO_SAMPLE *slot = _al_vector_ref(&auto_samples, i);

         slot->id = 0;
         al_destroy_sample_instance(slot->instance);
         slot->locked = false;

         slot->instance = al_create_sample_instance(NULL);
         if (!slot->instance) {
            ALLEGRO_ERROR("al_create_sample failed\n");
            goto Error;
         }
         if (!al_attach_sample_instance_to_mixer(slot->instance, default_mixer)) {
            ALLEGRO_ERROR("al_attach_mixer_to_sample failed\n");
            goto Error;
         }
      }      
   }

   return true;

Error:
   free_sample_vector();
   default_mixer = NULL;   
   return false;
}